

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::Calc_Sxi_eta_compact
          (ChElementBeamANCF_3243 *this,VectorN *Sxi_eta_compact,double xi,double eta,double zeta)

{
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[0] = 0.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[1] = 0.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[2] = (1.0 - xi) * this->m_thicknessY * 0.25;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[3] = 0.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[4] = 0.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[5] = 0.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[6] = (xi + 1.0) * this->m_thicknessY * 0.25;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[7] = 0.0;
  return;
}

Assistant:

void ChElementBeamANCF_3243::Calc_Sxi_eta_compact(VectorN& Sxi_eta_compact, double xi, double eta, double zeta) {
    Sxi_eta_compact(0) = 0.0;
    Sxi_eta_compact(1) = 0.0;
    Sxi_eta_compact(2) = 0.25 * m_thicknessY * (-xi + 1);
    Sxi_eta_compact(3) = 0.0;
    Sxi_eta_compact(4) = 0.0;
    Sxi_eta_compact(5) = 0.0;
    Sxi_eta_compact(6) = 0.25 * m_thicknessY * (xi + 1);
    Sxi_eta_compact(7) = 0.0;
}